

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::createInstance
          (FilteringAnisotropyTests *this,Context *context)

{
  FilteringAnisotropyInstance *this_00;
  Context *context_local;
  FilteringAnisotropyTests *this_local;
  
  this_00 = (FilteringAnisotropyInstance *)operator_new(0xb8);
  FilteringAnisotropyInstance::FilteringAnisotropyInstance(this_00,context,&this->m_refParams);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance*	createInstance				(Context&	context) const
	{
		return new FilteringAnisotropyInstance(context, m_refParams);
	}